

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<unsigned_long> * __thiscall
kj::_::ExceptionOr<unsigned_long>::operator=
          (ExceptionOr<unsigned_long> *this,ExceptionOr<unsigned_long> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<unsigned_long>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;